

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChClassFactory.h
# Opt level: O1

void * __thiscall
chrono::ChClassRegistration<chrono::ChFunction_Recorder>::create
          (ChClassRegistration<chrono::ChFunction_Recorder> *this,ChArchiveIn *marchive)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)::operator_new(0x28);
  *puVar2 = &PTR__ChFunction_Recorder_00b6d988;
  puVar1 = puVar2 + 1;
  puVar2[2] = puVar1;
  puVar2[1] = puVar1;
  puVar2[3] = 0;
  puVar2[4] = puVar1;
  return puVar2;
}

Assistant:

virtual void* create(ChArchiveIn& marchive) {
        return _archive_in_create(marchive);
    }